

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::ContextShaderProgram::shadeVertices
          (ContextShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int numComponents;
  GenericVecType GVar1;
  VertexPacket *pVVar2;
  pointer pGVar3;
  UniformSlot *pUVar4;
  int attribNdx;
  long lVar5;
  VertexAttrib *vertexAttrib;
  Vec2 local_b0;
  Vec3 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  VertexAttrib *local_88;
  VertexPacket **local_80;
  ulong local_78;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  rr local_40 [16];
  
  local_88 = inputs;
  local_80 = packets;
  pUVar4 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_coordScale");
  local_98 = *(undefined8 *)&pUVar4->value;
  uStack_90 = *(undefined8 *)((long)&pUVar4->value + 8);
  pUVar4 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_colorScale");
  local_68 = (pUVar4->value).f;
  local_70 = 0;
  local_78 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_78 = local_70;
  }
  local_98 = CONCAT44((float)local_98,(float)local_98);
  uStack_90 = CONCAT44((float)local_98,(float)local_98);
  local_58 = ZEXT416((uint)local_68);
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  for (; local_70 != local_78; local_70 = local_70 + 1) {
    pVVar2 = local_80[local_70];
    local_b0.m_data[0] = 1.0;
    local_b0.m_data[1] = 1.0;
    local_a8.m_data[0] = 1.0;
    local_a8.m_data[1] = 1.0;
    local_a8.m_data[2] = 1.0;
    vertexAttrib = local_88;
    for (lVar5 = 0;
        pGVar3 = (this->m_attrType).
                 super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>._M_impl
                 .super__Vector_impl_data._M_start,
        lVar5 < (int)((ulong)((long)(this->m_attrType).
                                    super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar3) >> 2)
        ; lVar5 = lVar5 + 1) {
      numComponents =
           (this->m_componentCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5];
      GVar1 = pGVar3[lVar5];
      if (GVar1 == GENERICVECTYPE_INT32) {
        rr::readVertexAttribInt(local_40,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
        calcShaderColorCoord<int>
                  (&local_b0,&local_a8,(Vector<int,_4> *)local_40,lVar5 == 0,numComponents);
      }
      else if (GVar1 == GENERICVECTYPE_UINT32) {
        rr::readVertexAttribUint(local_40,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
        calcShaderColorCoord<unsigned_int>
                  (&local_b0,&local_a8,(Vector<unsigned_int,_4> *)local_40,lVar5 == 0,numComponents)
        ;
      }
      else if (GVar1 == GENERICVECTYPE_FLOAT) {
        rr::readVertexAttribFloat(local_40,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
        calcShaderColorCoord<float>
                  (&local_b0,&local_a8,(Vector<float,_4> *)local_40,lVar5 == 0,numComponents);
      }
      vertexAttrib = vertexAttrib + 1;
    }
    (pVVar2->position).m_data[0] = local_b0.m_data[0] * (float)local_98;
    (pVVar2->position).m_data[1] = local_b0.m_data[1] * local_98._4_4_;
    (pVVar2->position).m_data[2] = 1.0;
    (pVVar2->position).m_data[3] = 1.0;
    *(ulong *)&pVVar2->outputs[0].v =
         CONCAT44(local_a8.m_data[1] * fStack_64,local_a8.m_data[0] * local_68);
    pVVar2->outputs[0].v.fData[2] = local_a8.m_data[2] * (float)local_58._0_4_;
    pVVar2->outputs[0].v.uData[3] = 0x3f800000;
  }
  return;
}

Assistant:

void ContextShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	const float	u_coordScale = getUniformByName("u_coordScale").value.f;
	const float u_colorScale = getUniformByName("u_colorScale").value.f;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const size_t varyingLocColor = 0;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Calc output color
		tcu::Vec2 coord = tcu::Vec2(1.0, 1.0);
		tcu::Vec3 color = tcu::Vec3(1.0, 1.0, 1.0);

		for (int attribNdx = 0; attribNdx < (int)m_attrType.size(); attribNdx++)
		{
			const int numComponents = m_componentCount[attribNdx];

			switch (m_attrType[attribNdx])
			{
				case rr::GENERICVECTYPE_FLOAT:	calcShaderColorCoord(coord, color, rr::readVertexAttribFloat(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				case rr::GENERICVECTYPE_INT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribInt	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				case rr::GENERICVECTYPE_UINT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribUint	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				default:
					DE_ASSERT(false);
			}
		}

		// Transform position
		{
			packet.position = tcu::Vec4(u_coordScale * coord.x(), u_coordScale * coord.y(), 1.0f, 1.0f);
		}

		// Pass color to FS
		{
			packet.outputs[varyingLocColor] = tcu::Vec4(u_colorScale * color.x(), u_colorScale * color.y(), u_colorScale * color.z(), 1.0f);
		}
	}
}